

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btContinuousConvexCollision.cpp
# Opt level: O1

bool __thiscall
btContinuousConvexCollision::calcTimeOfImpact
          (btContinuousConvexCollision *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btIDebugDraw *pbVar3;
  bool bVar4;
  btScalar bVar5;
  btScalar bVar6;
  uint uVar7;
  ulong uVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar9;
  float fVar10;
  btScalar bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float timeStep;
  btScalar bVar16;
  btScalar bVar17;
  float fVar18;
  btVector3 angVelB;
  btVector3 linVelB;
  btVector3 angVelA;
  btVector3 linVelA;
  btPointCollector pointCollector;
  btVector3 c;
  btVector3 axis;
  btPointCollector pointCollector1;
  btScalar angle;
  float local_198;
  btVector3 local_168;
  btVector3 local_158;
  btVector3 local_148;
  btVector3 local_138;
  btPointCollector local_128;
  btScalar local_f8;
  btScalar bStack_f4;
  btScalar bStack_f0;
  btScalar bStack_ec;
  btTransform local_e8;
  btPointCollector local_a0;
  btTransform local_70;
  
  uVar1 = *(undefined8 *)(toA->m_origin).m_floats;
  uVar2 = *(undefined8 *)(fromA->m_origin).m_floats;
  local_138.m_floats[1] = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
  local_138.m_floats[0] = (float)uVar1 - (float)uVar2;
  local_138.m_floats[2] = (toA->m_origin).m_floats[2] - (fromA->m_origin).m_floats[2];
  local_138.m_floats[3] = 0.0;
  btTransformUtil::calculateDiffAxisAngle(fromA,toA,(btVector3 *)&local_e8,(btScalar *)&local_70);
  local_148.m_floats[1] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[1];
  local_148.m_floats[0] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[0];
  local_148.m_floats[2] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[2];
  local_148.m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)(toB->m_origin).m_floats;
  uVar2 = *(undefined8 *)(fromB->m_origin).m_floats;
  local_158.m_floats[1] = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
  local_158.m_floats[0] = (float)uVar1 - (float)uVar2;
  local_158.m_floats[2] = (toB->m_origin).m_floats[2] - (fromB->m_origin).m_floats[2];
  local_158.m_floats[3] = 0.0;
  btTransformUtil::calculateDiffAxisAngle(fromB,toB,(btVector3 *)&local_e8,(btScalar *)&local_70);
  local_168.m_floats[1] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[1];
  local_168.m_floats[0] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[0];
  local_168.m_floats[2] =
       local_70.m_basis.m_el[0].m_floats[0] * local_e8.m_basis.m_el[0].m_floats[2];
  local_168.m_floats[3] = 0.0;
  (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[4])();
  fVar13 = 0.0;
  if (this->m_convexB1 != (btConvexShape *)0x0) {
    (*(this->m_convexB1->super_btCollisionShape)._vptr_btCollisionShape[4])();
    fVar13 = extraout_XMM0_Da_00;
  }
  fVar9 = local_148.m_floats[2] * local_148.m_floats[2] +
          local_148.m_floats[0] * local_148.m_floats[0] +
          local_148.m_floats[1] * local_148.m_floats[1];
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = local_168.m_floats[2] * local_168.m_floats[2] +
           local_168.m_floats[0] * local_168.m_floats[0] +
           local_168.m_floats[1] * local_168.m_floats[1];
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar14 = fVar9 * extraout_XMM0_Da + fVar13 * fVar10;
  fVar10 = local_158.m_floats[0] - local_138.m_floats[0];
  fVar13 = local_158.m_floats[1] - local_138.m_floats[1];
  fVar15 = local_158.m_floats[2] - local_138.m_floats[2];
  fVar9 = fVar15 * fVar15 + fVar10 * fVar10 + fVar13 * fVar13;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  if ((fVar9 + fVar14 != 0.0) || (NAN(fVar9 + fVar14))) {
    local_a0.super_Result._vptr_Result = (_func_int **)&PTR__Result_00227a40;
    local_a0.m_distance = 1e+18;
    local_a0.m_hasResult = false;
    computeClosestPoints(this,fromA,fromB,&local_a0);
    local_f8 = local_a0.m_pointInWorld.m_floats[0];
    bStack_f4 = local_a0.m_pointInWorld.m_floats[1];
    bStack_f0 = local_a0.m_pointInWorld.m_floats[2];
    bStack_ec = local_a0.m_pointInWorld.m_floats[3];
    if (local_a0.m_hasResult == true) {
      bVar11 = local_a0.m_normalOnBInWorld.m_floats[1];
      fVar9 = local_a0.m_normalOnBInWorld.m_floats[2];
      uVar8 = 0;
      if (fVar9 * fVar15 + fVar10 * local_a0.m_normalOnBInWorld.m_floats[0] + fVar13 * bVar11 +
          fVar14 <= 1.1920929e-07) goto LAB_0017c1f5;
      local_198 = local_a0.m_distance + result->m_allowedPenetration;
      timeStep = 0.0;
      fVar18 = 0.0;
      bVar16 = local_a0.m_normalOnBInWorld.m_floats[0];
      bVar17 = local_a0.m_normalOnBInWorld.m_floats[3];
      do {
        if (local_198 <= 0.001) {
          result->m_fraction = timeStep;
          (result->m_normal).m_floats[0] = bVar16;
          (result->m_normal).m_floats[1] = bVar11;
          (result->m_normal).m_floats[2] = fVar9;
          (result->m_normal).m_floats[3] = bVar17;
          *(undefined8 *)(result->m_hitPoint).m_floats = _local_f8;
          *(undefined8 *)((result->m_hitPoint).m_floats + 2) = _bStack_f0;
          uVar8 = 1;
          goto LAB_0017c1f5;
        }
        pbVar3 = result->m_debugDrawer;
        if (pbVar3 != (btIDebugDraw *)0x0) {
          local_e8.m_basis.m_el[0].m_floats[0] = 1.0;
          local_e8.m_basis.m_el[0].m_floats[1] = 1.0;
          local_e8.m_basis.m_el[0].m_floats[2] = 1.0;
          local_e8.m_basis.m_el[0].m_floats[3] = 0.0;
          (*pbVar3->_vptr_btIDebugDraw[7])(0x3e4ccccd,pbVar3,&local_f8,&local_e8);
        }
        fVar12 = fVar9 * fVar15 + fVar10 * bVar16 + bVar11 * fVar13 + fVar14;
        if (fVar12 <= 1.1920929e-07) {
          bVar4 = false;
        }
        else {
          timeStep = timeStep + local_198 / fVar12;
          bVar4 = false;
          if (((timeStep <= 1.0) && (bVar4 = false, 0.0 <= timeStep)) && (fVar18 < timeStep)) {
            btTransformUtil::integrateTransform(fromA,&local_138,&local_148,timeStep,&local_e8);
            btTransformUtil::integrateTransform(fromB,&local_158,&local_168,timeStep,&local_70);
            pbVar3 = result->m_debugDrawer;
            if (pbVar3 != (btIDebugDraw *)0x0) {
              local_128.super_Result._vptr_Result = (_func_int **)0x3f800000;
              local_128.m_normalOnBInWorld.m_floats[0] = 0.0;
              local_128.m_normalOnBInWorld.m_floats[1] = 0.0;
              (*pbVar3->_vptr_btIDebugDraw[7])(0x3e4ccccd,pbVar3,&local_e8.m_origin,&local_128);
            }
            (**result->_vptr_CastResult)(timeStep,result);
            local_128.super_Result._vptr_Result = (_func_int **)&PTR__Result_00227a40;
            local_128.m_distance = 1e+18;
            local_128.m_hasResult = false;
            computeClosestPoints(this,&local_e8,&local_70,&local_128);
            bVar6 = local_128.m_normalOnBInWorld.m_floats[3];
            bVar5 = local_128.m_normalOnBInWorld.m_floats[2];
            fVar18 = timeStep;
            if (local_128.m_hasResult == true) {
              local_198 = local_128.m_distance + result->m_allowedPenetration;
              bStack_f4 = local_128.m_pointInWorld.m_floats[1];
              local_f8 = local_128.m_pointInWorld.m_floats[0];
              bStack_ec = local_128.m_pointInWorld.m_floats[3];
              bStack_f0 = local_128.m_pointInWorld.m_floats[2];
              bVar16 = local_128.m_normalOnBInWorld.m_floats[0];
              bVar11 = local_128.m_normalOnBInWorld.m_floats[1];
              uVar7 = (int)uVar8 + 1;
              bVar4 = (int)uVar8 < 0x40;
              if (!bVar4) {
                (*result->_vptr_CastResult[2])(result,0xfffffffe,(ulong)uVar7);
              }
              uVar8 = (ulong)uVar7;
              fVar9 = bVar5;
              bVar17 = bVar6;
            }
            else {
              (*result->_vptr_CastResult[2])(result,0xffffffff,uVar8);
              bVar4 = false;
            }
          }
        }
      } while (bVar4);
    }
  }
  uVar8 = 0;
LAB_0017c1f5:
  return SUB81(uVar8,0);
}

Assistant:

bool	btContinuousConvexCollision::calcTimeOfImpact(
				const btTransform& fromA,
				const btTransform& toA,
				const btTransform& fromB,
				const btTransform& toB,
				CastResult& result)
{


	/// compute linear and angular velocity for this interval, to interpolate
	btVector3 linVelA,angVelA,linVelB,angVelB;
	btTransformUtil::calculateVelocity(fromA,toA,btScalar(1.),linVelA,angVelA);
	btTransformUtil::calculateVelocity(fromB,toB,btScalar(1.),linVelB,angVelB);


	btScalar boundingRadiusA = m_convexA->getAngularMotionDisc();
	btScalar boundingRadiusB = m_convexB1?m_convexB1->getAngularMotionDisc():0.f;

	btScalar maxAngularProjectedVelocity = angVelA.length() * boundingRadiusA + angVelB.length() * boundingRadiusB;
	btVector3 relLinVel = (linVelB-linVelA);

	btScalar relLinVelocLength = (linVelB-linVelA).length();
	
	if ((relLinVelocLength+maxAngularProjectedVelocity) == 0.f)
		return false;



	btScalar lambda = btScalar(0.);
	btVector3 v(1,0,0);

	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	bool hasResult = false;
	btVector3 c;

	btScalar lastLambda = lambda;
	//btScalar epsilon = btScalar(0.001);

	int numIter = 0;
	//first solution, using GJK


	btScalar radius = 0.001f;
//	result.drawCoordSystem(sphereTr);

	btPointCollector	pointCollector1;

	{
	
		computeClosestPoints(fromA,fromB,pointCollector1);

		hasResult = pointCollector1.m_hasResult;
		c = pointCollector1.m_pointInWorld;
	}

	if (hasResult)
	{
		btScalar dist;
		dist = pointCollector1.m_distance + result.m_allowedPenetration;
		n = pointCollector1.m_normalOnBInWorld;
		btScalar projectedLinearVelocity = relLinVel.dot(n);
		if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
			return false;

		//not close enough
		while (dist > radius)
		{
			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(c,0.2f,btVector3(1,1,1));
			}
			btScalar dLambda = btScalar(0.);

			projectedLinearVelocity = relLinVel.dot(n);

			
			//don't report time of impact for motion away from the contact normal (or causes minor penetration)
			if ((projectedLinearVelocity+ maxAngularProjectedVelocity)<=SIMD_EPSILON)
				return false;
			
			dLambda = dist / (projectedLinearVelocity+ maxAngularProjectedVelocity);

			
			
			lambda = lambda + dLambda;

			if (lambda > btScalar(1.))
				return false;

			if (lambda < btScalar(0.))
				return false;


			//todo: next check with relative epsilon
			if (lambda <= lastLambda)
			{
				return false;
				//n.setValue(0,0,0);
				break;
			}
			lastLambda = lambda;

			

			//interpolate to next lambda
			btTransform interpolatedTransA,interpolatedTransB,relativeTrans;

			btTransformUtil::integrateTransform(fromA,linVelA,angVelA,lambda,interpolatedTransA);
			btTransformUtil::integrateTransform(fromB,linVelB,angVelB,lambda,interpolatedTransB);
			relativeTrans = interpolatedTransB.inverseTimes(interpolatedTransA);

			if (result.m_debugDrawer)
			{
				result.m_debugDrawer->drawSphere(interpolatedTransA.getOrigin(),0.2f,btVector3(1,0,0));
			}

			result.DebugDraw( lambda );

			btPointCollector	pointCollector;
			computeClosestPoints(interpolatedTransA,interpolatedTransB,pointCollector);

			if (pointCollector.m_hasResult)
			{
				dist = pointCollector.m_distance+result.m_allowedPenetration;
				c = pointCollector.m_pointInWorld;		
				n = pointCollector.m_normalOnBInWorld;
			} else
			{
				result.reportFailure(-1, numIter);
				return false;
			}

			numIter++;
			if (numIter > maxIter)
			{
				result.reportFailure(-2, numIter);
				return false;
			}
		}
	
		result.m_fraction = lambda;
		result.m_normal = n;
		result.m_hitPoint = c;
		return true;
	}

	return false;

}